

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

LLVMPointsToSet __thiscall
dg::DGLLVMPointerAnalysis::getLLVMPointsTo(DGLLVMPointerAnalysis *this,Value *val)

{
  bool bVar1;
  PSNode *pPVar2;
  DGLLVMPointsToSet *this_00;
  unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_> in_RDI;
  PSNode *node;
  DGLLVMPointsToSet *pts;
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&> *in_stack_ffffffffffffffa8;
  DGLLVMPointerAnalysis *in_stack_ffffffffffffffb0;
  
  pPVar2 = getPointsToNode(in_stack_ffffffffffffffb0,(Value *)in_stack_ffffffffffffffa8);
  if (pPVar2 == (PSNode *)0x0) {
    this_00 = (DGLLVMPointsToSet *)operator_new(0x30);
    getUnknownPTSet();
    DGLLVMPointsToSet::DGLLVMPointsToSet(this_00,(PointsToSetT *)in_stack_ffffffffffffffa8);
  }
  else {
    bVar1 = pta::PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x16e6ed);
    if (bVar1) {
      operator_new(0x30);
      getUnknownPTSet();
      DGLLVMPointsToSet::DGLLVMPointsToSet
                ((DGLLVMPointsToSet *)in_stack_ffffffffffffffb0,
                 (PointsToSetT *)in_stack_ffffffffffffffa8);
    }
    else {
      operator_new(0x30);
      DGLLVMPointsToSet::DGLLVMPointsToSet
                ((DGLLVMPointsToSet *)in_stack_ffffffffffffffb0,
                 (PointsToSetT *)in_stack_ffffffffffffffa8);
    }
  }
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::toLLVMPointsToSet
            (in_stack_ffffffffffffffa8);
  return (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
         (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_dg::LLVMPointsToSetImpl_*,_std::default_delete<dg::LLVMPointsToSetImpl>_>
         .super__Head_base<0UL,_dg::LLVMPointsToSetImpl_*,_false>._M_head_impl;
}

Assistant:

LLVMPointsToSet getLLVMPointsTo(const llvm::Value *val) override {
        DGLLVMPointsToSet *pts;
        if (auto *node = getPointsToNode(val)) {
            if (node->pointsTo.empty()) {
                pts = new DGLLVMPointsToSet(getUnknownPTSet());
            } else {
                pts = new DGLLVMPointsToSet(node->pointsTo);
            }
        } else {
            pts = new DGLLVMPointsToSet(getUnknownPTSet());
        }
        return pts->toLLVMPointsToSet();
    }